

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::putIterate(Highs *this)

{
  HEkk *in_RDI;
  HighsStatus in_stack_0000003c;
  Highs *in_stack_00000040;
  HighsStatus local_4;
  
  if (((ulong)in_RDI->build_synthetic_tick_ & 1) == 0) {
    highsLogUser((HighsLogOptions *)&(in_RDI->analysis_).AnIterOp[4].AnIterOpRsMxNNZ,kError,
                 "putIterate: no simplex iterate to put\n");
    local_4 = kError;
  }
  else {
    HEkk::putIterate(in_RDI);
    local_4 = returnFromHighs(in_stack_00000040,in_stack_0000003c);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::putIterate() {
  // Check that there is a simplex iterate to put
  if (!ekk_instance_.status_.has_invert) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "putIterate: no simplex iterate to put\n");
    return HighsStatus::kError;
  }
  ekk_instance_.putIterate();
  return returnFromHighs(HighsStatus::kOk);
}